

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::I64ToI32Lowering::create(I64ToI32Lowering *this)

{
  _func_int **__s;
  
  __s = (_func_int **)operator_new(600);
  memset(__s,0,600);
  __s[2] = (_func_int *)(__s + 4);
  __s[0xb] = (_func_int *)0x0;
  __s[0xc] = (_func_int *)0x0;
  __s[0x21] = (_func_int *)0x0;
  __s[0x22] = (_func_int *)0x0;
  __s[0x23] = (_func_int *)0x0;
  __s[0x24] = (_func_int *)0x0;
  __s[0x25] = (_func_int *)0x0;
  *__s = (_func_int *)&PTR__I64ToI32Lowering_01072d90;
  __s[0x27] = (_func_int *)(__s + 0x2d);
  __s[0x28] = (_func_int *)0x1;
  __s[0x29] = (_func_int *)0x0;
  __s[0x2a] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0x2b) = 0x3f800000;
  __s[0x2c] = (_func_int *)0x0;
  __s[0x2d] = (_func_int *)0x0;
  __s[0x2e] = (_func_int *)(__s + 0x34);
  __s[0x2f] = (_func_int *)0x1;
  __s[0x30] = (_func_int *)0x0;
  __s[0x31] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0x32) = 0x3f800000;
  __s[0x33] = (_func_int *)0x0;
  __s[0x34] = (_func_int *)0x0;
  __s[0x35] = (_func_int *)(__s + 0x3b);
  __s[0x36] = (_func_int *)0x1;
  __s[0x37] = (_func_int *)0x0;
  __s[0x38] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0x39) = 0x3f800000;
  __s[0x3a] = (_func_int *)0x0;
  __s[0x3b] = (_func_int *)0x0;
  __s[0x3c] = (_func_int *)(__s + 0x42);
  __s[0x3d] = (_func_int *)0x1;
  __s[0x3e] = (_func_int *)0x0;
  __s[0x3f] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0x40) = 0x3f800000;
  __s[0x41] = (_func_int *)0x0;
  __s[0x42] = (_func_int *)0x0;
  __s[0x43] = (_func_int *)(__s + 0x49);
  __s[0x44] = (_func_int *)0x1;
  __s[0x45] = (_func_int *)0x0;
  __s[0x46] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0x47) = 0x3f800000;
  __s[0x48] = (_func_int *)0x0;
  __s[0x49] = (_func_int *)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
  ).super_Pass._vptr_Pass = __s;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<I64ToI32Lowering>();
  }